

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O3

string * __thiscall
cmExportInstallFileGenerator::GetConfigImportFileGlob_abi_cxx11_
          (string *__return_storage_ptr__,cmExportInstallFileGenerator *this)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  undefined8 local_28;
  char *local_20;
  size_type local_18;
  pointer local_10;
  
  local_38._M_str = (this->super_cmExportFileGenerator).FileBase._M_dataplus._M_p;
  local_38._M_len = (this->super_cmExportFileGenerator).FileBase._M_string_length;
  local_28 = 2;
  local_20 = "-*";
  local_10 = (this->super_cmExportFileGenerator).FileExt._M_dataplus._M_p;
  local_18 = (this->super_cmExportFileGenerator).FileExt._M_string_length;
  views._M_len = 3;
  views._M_array = &local_38;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportInstallFileGenerator::GetConfigImportFileGlob()
{
  std::string glob = cmStrCat(this->FileBase, "-*", this->FileExt);
  return glob;
}